

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void av1_pick_filter_restoration(YV12_BUFFER_CONFIG *src,AV1_COMP *cpi)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  RestorationType RVar4;
  RestUnitSearchInfo *pRVar5;
  void *pvVar6;
  long in_RSI;
  double dVar7;
  int plane_6;
  _Bool free_buffers;
  int plane_5;
  int u;
  int plane_num_units_1;
  int plane_4;
  _Bool all_none;
  double cost_this_size;
  double cost_this_plane;
  RestorationType r;
  double best_cost_this_plane;
  RestorationType num_rtypes;
  int plane_num_units;
  int plane_3;
  RestorationType best_rtype [3];
  int64_t sse_this_size;
  int64_t bits_this_size;
  int luma_unit_size;
  int best_luma_unit_size;
  double best_cost;
  int plane_h;
  int plane_w;
  int is_uv;
  YV12_BUFFER_CONFIG *dgd;
  int plane_2;
  bool disable_lr_filter [4];
  int plane_end;
  int plane_start;
  int plane_1;
  int buf_size;
  _Bool allocate_buffers;
  RestSearchCtxt rsc;
  int plane;
  int max_lr_unit_size;
  int min_lr_unit_size;
  int highbd;
  int num_planes;
  LOOP_FILTER_SPEED_FEATURES *lpf_sf;
  SequenceHeader *seq_params;
  MACROBLOCK *x;
  AV1_COMMON *cm;
  FRAME_CONTEXT *in_stack_fffffffffffffd98;
  undefined8 uVar8;
  int border_vert;
  ModeCosts *in_stack_fffffffffffffda0;
  undefined1 *memblk;
  uint8_t *data;
  LOOP_FILTER_SPEED_FEATURES *lpf_sf_00;
  int in_stack_fffffffffffffdc0;
  int highbd_00;
  int in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffdcc;
  undefined2 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd2;
  undefined1 in_stack_fffffffffffffdd3;
  byte bVar10;
  uint uVar11;
  uint local_228;
  int local_224;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  uint local_210;
  RestorationType local_1f4;
  double local_1f0;
  uint local_1e0;
  RestorationType local_1dc [3];
  long local_1d0;
  long local_1c8;
  uint local_1c0;
  uint local_1bc;
  double local_1b8;
  int local_1ac;
  int local_1a8;
  uint local_1a4;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  int iVar12;
  uint local_188;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  uint uVar13;
  undefined1 local_178 [11];
  undefined1 in_stack_fffffffffffffe93;
  int in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  aom_codec_frame_buffer_t *in_stack_ffffffffffffff00;
  aom_get_frame_buffer_cb_fn_t in_stack_ffffffffffffff08;
  void *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff20;
  long alStack_d8 [16];
  void *local_58;
  long local_50;
  int local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  int local_34;
  LOOP_FILTER_SPEED_FEATURES *local_30;
  undefined8 local_28;
  long local_20;
  AV1_COMMON *local_18;
  long local_10;
  
  local_18 = (AV1_COMMON *)(in_RSI + 0x3bf80);
  local_20 = in_RSI + 0x15030;
  local_28 = *(undefined8 *)(in_RSI + 0x42008);
  local_30 = (LOOP_FILTER_SPEED_FEATURES *)(in_RSI + 0x60c54);
  local_10 = in_RSI;
  local_34 = av1_num_planes(local_18);
  local_38 = (uint)local_18->seq_params->use_highbitdepth;
  av1_fill_lr_rates(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  local_228 = *(uint *)(local_10 + 0x60c78);
  uVar11 = *(uint *)(local_10 + 0x60c7c);
  if ((int)local_228 <= (int)(uint)block_size_wide[local_18->seq_params->sb_size]) {
    local_228 = (uint)block_size_wide[local_18->seq_params->sb_size];
  }
  local_3c = local_228;
  if ((int)uVar11 < (int)local_228) {
    uVar11 = local_228;
  }
  local_40 = uVar11;
  for (local_44 = 0; local_44 < local_34; local_44 = local_44 + 1) {
    pRVar5 = allocate_search_structs
                       ((AV1_COMMON *)
                        CONCAT44(uVar11,CONCAT13(in_stack_fffffffffffffdd3,
                                                 CONCAT12(in_stack_fffffffffffffdd2,
                                                          in_stack_fffffffffffffdd0))),
                        (RestorationInfo *)
                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                        in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0);
    *(RestUnitSearchInfo **)(local_10 + 0x9d2c0 + (long)local_44 * 8) = pRVar5;
  }
  *(undefined4 *)(local_20 + 0x4218) = *(undefined4 *)(local_10 + 0x6029c);
  uVar8 = CONCAT44((int)((ulong)in_stack_fffffffffffffd98 >> 0x20),0x20);
  memblk = (undefined1 *)
           CONCAT44((int)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                    (local_18->features).byte_alignment);
  pRVar5 = (RestUnitSearchInfo *)0x0;
  data = (uint8_t *)0x0;
  lpf_sf_00 = (LOOP_FILTER_SPEED_FEATURES *)0x0;
  highbd_00 = 0;
  uVar9 = 0;
  iVar2 = aom_realloc_frame_buffer
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                     in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,
                     in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,
                     (_Bool)in_stack_fffffffffffffe93,in_stack_ffffffffffffff20);
  if (iVar2 != 0) {
    aom_internal_error(local_18->error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate trial restored frame buffer");
  }
  local_58 = (void *)0x0;
  local_50 = 0;
  bVar10 = 0;
  if ((*(byte *)(local_10 + 0x60c8c) & 1) == 0) {
    bVar10 = local_38 != 0 ^ 0xff;
  }
  uVar13 = CONCAT13(bVar10,(int3)in_stack_fffffffffffffe84) & 0x1ffffff;
  if ((char)(uVar13 >> 0x18) != '\0') {
    in_stack_fffffffffffffe80 = 0xc0000;
    pvVar6 = aom_memalign((size_t)lpf_sf_00,(size_t)data);
    *(void **)(local_10 + 0x9d2d8) = pvVar6;
    if (*(long *)(local_10 + 0x9d2d8) == 0) {
      aom_internal_error(local_18->error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cpi->pick_lr_ctxt.dgd_avg");
    }
    local_58 = *(void **)(local_10 + 0x9d2d8);
    memset(local_58,0,0xc0000);
    local_50 = (long)local_58 + 0x60000;
  }
  for (iVar2 = 0; iVar2 < local_34; iVar2 = iVar2 + 1) {
    local_18->rst_info[iVar2].frame_restoration_type = RESTORE_NONE;
  }
  local_188 = (uint)(local_30->disable_loop_restoration_luma != 0);
  if ((local_34 == 1) || (local_30->disable_loop_restoration_chroma != 0)) {
    iVar12 = 0;
  }
  else {
    iVar12 = 2;
  }
  memset(&stack0xfffffffffffffe70,0,4);
  av1_derive_flags_for_lr_processing(local_30,(_Bool *)&stack0xfffffffffffffe70);
  for (uVar3 = local_188; border_vert = (int)((ulong)uVar8 >> 0x20), (int)uVar3 <= iVar12;
      uVar3 = uVar3 + 1) {
    local_1a4 = (uint)(uVar3 != 0);
    av1_get_upsampled_plane_size(local_18,local_1a4,&local_1a8,&local_1ac);
    uVar8 = CONCAT44(border_vert,local_38);
    av1_extend_frame(data,(int)((ulong)pRVar5 >> 0x20),(int)pRVar5,(int)((ulong)memblk >> 0x20),
                     (int)memblk,border_vert,highbd_00);
  }
  local_1b8 = 1.79769313486232e+308;
  local_1bc = local_40;
  for (local_1c0 = local_40; (int)local_3c <= (int)local_1c0; local_1c0 = (int)local_1c0 >> 1) {
    local_1c8 = 0;
    local_1d0 = 0;
    memset(local_1dc,0,0xc);
    for (local_1e0 = local_188; (int)local_1e0 <= iVar12; local_1e0 = local_1e0 + 1) {
      set_restoration_unit_size
                ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffdc4,highbd_00),
                 (RestorationInfo *)lpf_sf_00,(int)((ulong)data >> 0x20),(int)data);
      memblk = local_178;
      init_rsc((YV12_BUFFER_CONFIG *)
               CONCAT44(uVar11,CONCAT13(bVar10,CONCAT12(in_stack_fffffffffffffdd2,
                                                        in_stack_fffffffffffffdd0))),
               (AV1_COMMON *)CONCAT44(in_stack_fffffffffffffdcc,uVar9),
               (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffdc4,highbd_00),lpf_sf_00,
               (int)((ulong)data >> 0x20),pRVar5,
               (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               (RestSearchCtxt *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      restoration_search((AV1_COMMON *)CONCAT44(uVar13,in_stack_fffffffffffffe80),iVar2,
                         (RestSearchCtxt *)CONCAT44(iVar12,in_stack_fffffffffffffe70),
                         (_Bool *)CONCAT44(uVar3,in_stack_fffffffffffffe68));
      RVar4 = RESTORE_SWITCHABLE;
      if (1 < local_18->rst_info[(int)local_1e0].num_rest_units) {
        RVar4 = RESTORE_TYPES;
      }
      local_1f0 = 1.79769313486232e+308;
      for (local_1f4 = RESTORE_NONE; local_1f4 < RVar4; local_1f4 = local_1f4 + RESTORE_WIENER) {
        if (((local_178[(ulong)local_1f4 - 0x18] & 1) == 0) &&
           (dVar7 = (double)(alStack_d8[(ulong)local_1f4 - 4] >>
                            (((char)local_18->seq_params->bit_depth + -8) * '\x02' & 0x3fU)) * 128.0
                    + ((double)(alStack_d8[local_1f4] >> 4) * (double)*(int *)(local_20 + 0x4218)) /
                      512.0, dVar7 < local_1f0)) {
          local_1dc[(int)local_1e0] = local_1f4;
          local_1f0 = dVar7;
        }
      }
      local_1c8 = alStack_d8[local_1dc[(int)local_1e0]] + local_1c8;
      local_1d0 = alStack_d8[(ulong)local_1dc[(int)local_1e0] - 4] + local_1d0;
    }
    dVar7 = (double)(local_1d0 >> (((char)local_18->seq_params->bit_depth + -8) * '\x02' & 0x3fU)) *
            128.0 + ((double)(local_1c8 >> 4) * (double)*(int *)(local_20 + 0x4218)) / 512.0;
    if (local_1b8 <= dVar7) break;
    local_1b8 = dVar7;
    local_1bc = local_1c0;
    bVar1 = true;
    for (local_210 = local_188; (int)local_210 <= iVar12; local_210 = local_210 + 1) {
      local_18->rst_info[(int)local_210].frame_restoration_type = local_1dc[(int)local_210];
      if (local_1dc[(int)local_210] != RESTORE_NONE) {
        bVar1 = false;
        in_stack_fffffffffffffdec = local_18->rst_info[(int)local_210].num_rest_units;
        for (in_stack_fffffffffffffde8 = 0; in_stack_fffffffffffffde8 < in_stack_fffffffffffffdec;
            in_stack_fffffffffffffde8 = in_stack_fffffffffffffde8 + 1) {
          copy_unit_info(local_1dc[(int)local_210],
                         (RestUnitSearchInfo *)
                         (*(long *)(local_10 + 0x9d2c0 + (long)(int)local_210 * 8) +
                         (long)in_stack_fffffffffffffde8 * 0x40),
                         local_18->rst_info[(int)local_210].unit_info + in_stack_fffffffffffffde8);
        }
      }
    }
    if (bVar1) break;
  }
  for (iVar2 = 0; iVar2 < local_34; iVar2 = iVar2 + 1) {
    set_restoration_unit_size
              ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffdc4,highbd_00),
               (RestorationInfo *)lpf_sf_00,(int)((ulong)data >> 0x20),(int)data);
  }
  if ((*(byte *)(local_10 + 0x60c8c) & 1) == 0 && local_38 == 0) {
    aom_free(memblk);
    *(undefined8 *)(local_10 + 0x9d2d8) = 0;
  }
  for (local_224 = 0; local_224 < local_34; local_224 = local_224 + 1) {
    aom_free(memblk);
    *(undefined8 *)(local_10 + 0x9d2c0 + (long)local_224 * 8) = 0;
  }
  return;
}

Assistant:

void av1_pick_filter_restoration(const YV12_BUFFER_CONFIG *src, AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &cpi->td.mb;
  const SequenceHeader *const seq_params = cm->seq_params;
  const LOOP_FILTER_SPEED_FEATURES *lpf_sf = &cpi->sf.lpf_sf;
  const int num_planes = av1_num_planes(cm);
  const int highbd = cm->seq_params->use_highbitdepth;
  assert(!cm->features.all_lossless);

  av1_fill_lr_rates(&x->mode_costs, x->e_mbd.tile_ctx);

  // Select unit size based on speed feature settings, and allocate
  // rui structs based on this size
  int min_lr_unit_size = cpi->sf.lpf_sf.min_lr_unit_size;
  int max_lr_unit_size = cpi->sf.lpf_sf.max_lr_unit_size;

  // The minimum allowed unit size at a syntax level is 1 superblock.
  // Apply this constraint here so that the speed features code which sets
  // cpi->sf.lpf_sf.min_lr_unit_size does not need to know the superblock size
  min_lr_unit_size =
      AOMMAX(min_lr_unit_size, block_size_wide[cm->seq_params->sb_size]);

  max_lr_unit_size = AOMMAX(min_lr_unit_size, max_lr_unit_size);

  for (int plane = 0; plane < num_planes; ++plane) {
    cpi->pick_lr_ctxt.rusi[plane] = allocate_search_structs(
        cm, &cm->rst_info[plane], plane > 0, min_lr_unit_size);
  }

  x->rdmult = cpi->rd.RDMULT;

  // Allocate the frame buffer trial_frame_rst, which is used to temporarily
  // store the loop restored frame.
  if (aom_realloc_frame_buffer(
          &cpi->trial_frame_rst, cm->superres_upscaled_width,
          cm->superres_upscaled_height, seq_params->subsampling_x,
          seq_params->subsampling_y, highbd, AOM_RESTORATION_FRAME_BORDER,
          cm->features.byte_alignment, NULL, NULL, NULL, false, 0))
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate trial restored frame buffer");

  RestSearchCtxt rsc;

  // The buffers 'src_avg' and 'dgd_avg' are used to compute H and M buffers.
  // These buffers are only required for the AVX2 and NEON implementations of
  // av1_compute_stats. The buffer size required is calculated based on maximum
  // width and height of the LRU (i.e., from foreach_rest_unit_in_plane() 1.5
  // times the RESTORATION_UNITSIZE_MAX) allowed for Wiener filtering. The width
  // and height aligned to multiple of 16 is considered for intrinsic purpose.
  rsc.dgd_avg = NULL;
  rsc.src_avg = NULL;
#if HAVE_AVX2 || HAVE_NEON || HAVE_SVE
  // The buffers allocated below are used during Wiener filter processing.
  // Hence, allocate the same when Wiener filter is enabled. Make sure to
  // allocate these buffers only for the SIMD extensions that make use of them
  // (i.e. AVX2 for low bitdepth and NEON and SVE for low and high bitdepth).
#if HAVE_AVX2
  bool allocate_buffers = !cpi->sf.lpf_sf.disable_wiener_filter && !highbd;
#elif HAVE_NEON || HAVE_SVE
  bool allocate_buffers = !cpi->sf.lpf_sf.disable_wiener_filter;
#endif
  if (allocate_buffers) {
    const int buf_size = sizeof(*cpi->pick_lr_ctxt.dgd_avg) * 6 *
                         RESTORATION_UNITSIZE_MAX * RESTORATION_UNITSIZE_MAX;
    CHECK_MEM_ERROR(cm, cpi->pick_lr_ctxt.dgd_avg,
                    (int16_t *)aom_memalign(32, buf_size));

    rsc.dgd_avg = cpi->pick_lr_ctxt.dgd_avg;
    // When LRU width isn't multiple of 16, the 256 bits load instruction used
    // in AVX2 intrinsic can read data beyond valid LRU. Hence, in order to
    // silence Valgrind warning this buffer is initialized with zero. Overhead
    // due to this initialization is negligible since it is done at frame level.
    memset(rsc.dgd_avg, 0, buf_size);
    rsc.src_avg =
        rsc.dgd_avg + 3 * RESTORATION_UNITSIZE_MAX * RESTORATION_UNITSIZE_MAX;
    // Asserts the starting address of src_avg is always 32-bytes aligned.
    assert(!((intptr_t)rsc.src_avg % 32));
  }
#endif

  // Initialize all planes, so that any planes we skip searching will still have
  // valid data
  for (int plane = 0; plane < num_planes; plane++) {
    cm->rst_info[plane].frame_restoration_type = RESTORE_NONE;
  }

  // Decide which planes to search
  int plane_start, plane_end;

  if (lpf_sf->disable_loop_restoration_luma) {
    plane_start = AOM_PLANE_U;
  } else {
    plane_start = AOM_PLANE_Y;
  }

  if (num_planes == 1 || lpf_sf->disable_loop_restoration_chroma) {
    plane_end = AOM_PLANE_Y;
  } else {
    plane_end = AOM_PLANE_V;
  }

  // Derive the flags to enable/disable Loop restoration filters based on the
  // speed features 'disable_wiener_filter' and 'disable_sgr_filter'.
  bool disable_lr_filter[RESTORE_TYPES] = { false };
  av1_derive_flags_for_lr_processing(lpf_sf, disable_lr_filter);

  for (int plane = plane_start; plane <= plane_end; plane++) {
    const YV12_BUFFER_CONFIG *dgd = &cm->cur_frame->buf;
    const int is_uv = plane != AOM_PLANE_Y;
    int plane_w, plane_h;
    av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);
    av1_extend_frame(dgd->buffers[plane], plane_w, plane_h, dgd->strides[is_uv],
                     RESTORATION_BORDER, RESTORATION_BORDER, highbd);
  }

  double best_cost = DBL_MAX;
  int best_luma_unit_size = max_lr_unit_size;
  for (int luma_unit_size = max_lr_unit_size;
       luma_unit_size >= min_lr_unit_size; luma_unit_size >>= 1) {
    int64_t bits_this_size = 0;
    int64_t sse_this_size = 0;
    RestorationType best_rtype[MAX_MB_PLANE] = { RESTORE_NONE, RESTORE_NONE,
                                                 RESTORE_NONE };
    for (int plane = plane_start; plane <= plane_end; ++plane) {
      set_restoration_unit_size(cm, &cm->rst_info[plane], plane > 0,
                                luma_unit_size);
      init_rsc(src, &cpi->common, x, lpf_sf, plane,
               cpi->pick_lr_ctxt.rusi[plane], &cpi->trial_frame_rst, &rsc);

      restoration_search(cm, plane, &rsc, disable_lr_filter);

      const int plane_num_units = cm->rst_info[plane].num_rest_units;
      const RestorationType num_rtypes =
          (plane_num_units > 1) ? RESTORE_TYPES : RESTORE_SWITCHABLE_TYPES;
      double best_cost_this_plane = DBL_MAX;
      for (RestorationType r = 0; r < num_rtypes; ++r) {
        // Disable Loop restoration filter based on the flags set using speed
        // feature 'disable_wiener_filter' and 'disable_sgr_filter'.
        if (disable_lr_filter[r]) continue;

        double cost_this_plane = RDCOST_DBL_WITH_NATIVE_BD_DIST(
            x->rdmult, rsc.total_bits[r] >> 4, rsc.total_sse[r],
            cm->seq_params->bit_depth);

        if (cost_this_plane < best_cost_this_plane) {
          best_cost_this_plane = cost_this_plane;
          best_rtype[plane] = r;
        }
      }

      bits_this_size += rsc.total_bits[best_rtype[plane]];
      sse_this_size += rsc.total_sse[best_rtype[plane]];
    }

    double cost_this_size = RDCOST_DBL_WITH_NATIVE_BD_DIST(
        x->rdmult, bits_this_size >> 4, sse_this_size,
        cm->seq_params->bit_depth);

    if (cost_this_size < best_cost) {
      best_cost = cost_this_size;
      best_luma_unit_size = luma_unit_size;
      // Copy parameters out of rusi struct, before we overwrite it at
      // the start of the next iteration
      bool all_none = true;
      for (int plane = plane_start; plane <= plane_end; ++plane) {
        cm->rst_info[plane].frame_restoration_type = best_rtype[plane];
        if (best_rtype[plane] != RESTORE_NONE) {
          all_none = false;
          const int plane_num_units = cm->rst_info[plane].num_rest_units;
          for (int u = 0; u < plane_num_units; ++u) {
            copy_unit_info(best_rtype[plane], &cpi->pick_lr_ctxt.rusi[plane][u],
                           &cm->rst_info[plane].unit_info[u]);
          }
        }
      }
      // Heuristic: If all best_rtype entries are RESTORE_NONE, this means we
      // couldn't find any good filters at this size. So we likely won't find
      // any good filters at a smaller size either, so skip
      if (all_none) {
        break;
      }
    } else {
      // Heuristic: If this size is worse than the previous (larger) size, then
      // the next size down will likely be even worse, so skip
      break;
    }
  }

  // Final fixup to set the correct unit size
  // We set this for all planes, even ones we have skipped searching,
  // so that other code does not need to care which planes were and weren't
  // searched
  for (int plane = 0; plane < num_planes; ++plane) {
    set_restoration_unit_size(cm, &cm->rst_info[plane], plane > 0,
                              best_luma_unit_size);
  }

#if HAVE_AVX2 || HAVE_NEON || HAVE_SVE
#if HAVE_AVX2
  bool free_buffers = !cpi->sf.lpf_sf.disable_wiener_filter && !highbd;
#elif HAVE_NEON || HAVE_SVE
  bool free_buffers = !cpi->sf.lpf_sf.disable_wiener_filter;
#endif
  if (free_buffers) {
    aom_free(cpi->pick_lr_ctxt.dgd_avg);
    cpi->pick_lr_ctxt.dgd_avg = NULL;
  }
#endif
  for (int plane = 0; plane < num_planes; plane++) {
    aom_free(cpi->pick_lr_ctxt.rusi[plane]);
    cpi->pick_lr_ctxt.rusi[plane] = NULL;
  }
}